

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

bool __thiscall
EDLines::TryToJoinTwoLineSegments(EDLines *this,LineSegment *ls1,LineSegment *ls2,int changeIndex)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  LineSegment *pLVar5;
  int iVar6;
  long lVar7;
  pointer pLVar8;
  LineSegment *pLVar9;
  byte bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int which;
  int local_3c;
  double local_38;
  
  bVar10 = 0;
  dVar11 = ComputeMinDistanceBetweenTwoLines(ls1,ls2,&local_3c);
  if (this->max_distance_between_two_lines <= dVar11 &&
      dVar11 != this->max_distance_between_two_lines) {
    return false;
  }
  dVar11 = ls1->sx - ls1->ex;
  dVar12 = ls1->sy - ls1->ey;
  dVar11 = dVar11 * dVar11 + dVar12 * dVar12;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar12 = ls2->sx - ls2->ex;
  dVar13 = ls2->sy - ls2->ey;
  dVar12 = dVar12 * dVar12 + dVar13 * dVar13;
  if (dVar12 < 0.0) {
    local_38 = dVar11;
    dVar12 = sqrt(dVar12);
    dVar11 = local_38;
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  pLVar9 = ls2;
  pLVar5 = ls1;
  if (dVar12 < dVar11) {
    pLVar9 = ls1;
    pLVar5 = ls2;
  }
  local_38 = ComputeMinDistance(pLVar5->sx,pLVar5->sy,pLVar9->a,pLVar9->b,pLVar9->invert);
  dVar11 = ComputeMinDistance((pLVar5->sx + pLVar5->ex) * 0.5,(pLVar5->sy + pLVar5->ey) * 0.5,
                              pLVar9->a,pLVar9->b,pLVar9->invert);
  local_38 = dVar11 + local_38;
  dVar11 = ComputeMinDistance(pLVar5->ex,pLVar5->ey,pLVar9->a,pLVar9->b,pLVar9->invert);
  dVar11 = (dVar11 + local_38) / 3.0;
  pdVar1 = &this->max_error;
  if ((!NAN(dVar11) && !NAN(*pdVar1)) && (dVar11 >= *pdVar1 && dVar11 != *pdVar1)) {
    return dVar11 < *pdVar1 || dVar11 == *pdVar1;
  }
  dVar11 = ls2->sx;
  dVar12 = ls2->sy;
  dVar15 = ABS(ls1->sy - dVar12) + ABS(ls1->sx - dVar11);
  local_3c = 1;
  dVar13 = ls2->ex;
  dVar2 = ls2->ey;
  dVar14 = ABS(ls1->sy - dVar2) + ABS(ls1->sx - dVar13);
  if (dVar15 < dVar14) {
    local_3c = 2;
    dVar15 = dVar14;
  }
  dVar14 = ls1->ex;
  dVar3 = ls1->ey;
  dVar17 = ABS(dVar3 - dVar12) + ABS(dVar14 - dVar11);
  dVar18 = dVar17;
  if (dVar17 <= dVar15) {
    dVar18 = dVar15;
  }
  dVar16 = ABS(dVar3 - dVar2) + ABS(dVar14 - dVar13);
  if ((dVar15 < dVar17) || (dVar18 < dVar16)) {
    local_3c = (dVar18 < dVar16) + 3;
  }
  if (local_3c == 3) {
    ls1->sx = dVar11;
    ls1->sy = dVar12;
  }
  else {
    if (local_3c != 2) {
      if (local_3c == 1) {
        ls1->ex = dVar11;
        ls1->ey = dVar12;
        goto LAB_00119dde;
      }
      ls1->sx = dVar14;
      ls1->sy = dVar3;
    }
    ls1->ex = dVar13;
    ls1->ey = dVar2;
  }
LAB_00119dde:
  iVar4 = ls1->len;
  iVar6 = ls2->len;
  if (ls1->firstPixelIndex + iVar4 + 5 < ls2->firstPixelIndex) {
    if (iVar6 <= iVar4) goto LAB_00119e04;
    ls1->firstPixelIndex = ls2->firstPixelIndex;
  }
  else {
    iVar6 = iVar6 + iVar4;
  }
  ls1->len = iVar6;
LAB_00119e04:
  UpdateLineParameters(ls1);
  pLVar8 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
           super__Vector_impl_data._M_start + changeIndex;
  pLVar8->len = ls1->len;
  for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
    pLVar8->a = ls1->a;
    ls1 = (LineSegment *)((long)ls1 + (ulong)bVar10 * -0x10 + 8);
    pLVar8 = (pointer)((long)pLVar8 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  return true;
}

Assistant:

bool EDLines::TryToJoinTwoLineSegments(LineSegment * ls1, LineSegment * ls2, int changeIndex)
{	
	int which;
	double dist = ComputeMinDistanceBetweenTwoLines(ls1, ls2, &which);
	if (dist > max_distance_between_two_lines) return false;

	// Compute line lengths. Use the longer one as the ground truth
	double dx = ls1->sx - ls1->ex;
	double dy = ls1->sy - ls1->ey;
	double prevLen = sqrt(dx*dx + dy*dy);

	dx = ls2->sx - ls2->ex;
	dy = ls2->sy - ls2->ey;
	double nextLen = sqrt(dx*dx + dy*dy);

	// Use the longer line as the ground truth
	LineSegment *shorter = ls1;
	LineSegment *longer = ls2;

	if (prevLen > nextLen) { shorter = ls2; longer = ls1; }

#if 0
	// Use 5 points to check for collinearity  
#define POINT_COUNT 5
	double decr = 1.0 / (POINT_COUNT - 1);
	double alpha = 1.0;
	dist = 0.0;

	while (alpha >= 0.0) {
		double px = alpha*shorter->sx + (1.0 - alpha)*shorter->ex;
		double py = alpha*shorter->sy + (1.0 - alpha)*shorter->ey;

		dist += ComputeMinDistance(px, py, longer->a, longer->b, longer->invert);

		alpha -= decr;
	} //end-while

	dist /= POINT_COUNT;

#undef POINT_COUNT

#else
	// Just use 3 points to check for collinearity  
	dist = ComputeMinDistance(shorter->sx, shorter->sy, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance((shorter->sx + shorter->ex) / 2.0, (shorter->sy + shorter->ey) / 2.0, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance(shorter->ex, shorter->ey, longer->a, longer->b, longer->invert);

	dist /= 3.0;
#endif

	if (dist > max_error) return false;

#if 0
	// Update the end points of ls1
	if (which == 0) {       // SS
		ls1->sx = ls2->ex;
		ls1->sy = ls2->ey;

	}
	else if (which == 1) { // SE
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else if (which == 2) { // ES
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else {                // EE
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;
	} //end-else

#else
	/// 4 cases: 1:(s1, s2), 2:(s1, e2), 3:(e1, s2), 4:(e1, e2)

	/// case 1: (s1, s2)
	dx = fabs(ls1->sx - ls2->sx);
	dy = fabs(ls1->sy - ls2->sy);
	double d = dx + dy;
	double max = d;
	which = 1;

	/// case 2: (s1, e2)
	dx = fabs(ls1->sx - ls2->ex);
	dy = fabs(ls1->sy - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 2;
	} //end-if

	  /// case 3: (e1, s2)
	dx = fabs(ls1->ex - ls2->sx);
	dy = fabs(ls1->ey - ls2->sy);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 3;
	} //end-if

	  /// case 4: (e1, e2)
	dx = fabs(ls1->ex - ls2->ex);
	dy = fabs(ls1->ey - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 4;
	} //end-if

	if (which == 1) {
		// (s1, s2)
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;

	}
	else if (which == 2) {
		// (s1, e2)
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else if (which == 3) {
		// (e1, s2)
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else {
		// (e1, e2)
		ls1->sx = ls1->ex;
		ls1->sy = ls1->ey;

		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;
	} //end-else

#endif

	  // Update the first line's parameters
	if (ls1->firstPixelIndex + ls1->len + 5 >= ls2->firstPixelIndex) ls1->len += ls2->len;
	else if (ls2->len > ls1->len) {
		ls1->firstPixelIndex = ls2->firstPixelIndex;
		ls1->len = ls2->len;
	} //end-if

	UpdateLineParameters(ls1);
	lines[changeIndex] = *ls1;

	return true;
}